

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::create_convert
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  std_converter<wchar_t> *this_00;
  utf8_converter *this_01;
  std_converter<char> *this_02;
  allocator local_81;
  string encoding;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (type == 2) {
    this_00 = (std_converter<wchar_t> *)operator_new(0x20);
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
    std_converter<wchar_t>::std_converter(this_00,(shared_ptr<__locale_struct_*> *)&local_60,0);
    std::locale::locale<booster::locale::impl_posix::std_converter<wchar_t>>
              ((locale *)this,in,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    return (locale)(_Impl *)this;
  }
  if (type == 1) {
    pcVar4 = nl_langinfo_l(0xe,(__locale_t)
                               *(lc->
                                super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
    std::__cxx11::string::string((string *)&encoding,pcVar4,&local_81);
    p_Var1 = &local_50;
    for (uVar3 = 0; uVar5 = (ulong)uVar3, uVar5 < encoding._M_string_length; uVar3 = uVar3 + 1) {
      if ((byte)(encoding._M_dataplus._M_p[uVar5] + 0xbfU) < 0x1a) {
        encoding._M_dataplus._M_p[uVar5] = encoding._M_dataplus._M_p[uVar5] | 0x20;
      }
    }
    bVar2 = std::operator==(&encoding,"utf-8");
    if (((bVar2) || (bVar2 = std::operator==(&encoding,"utf8"), bVar2)) ||
       (bVar2 = std::operator==(&encoding,"utf_8"), bVar2)) {
      this_01 = (utf8_converter *)operator_new(0x20);
      std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
      utf8_converter::utf8_converter(this_01,(shared_ptr<__locale_struct_*> *)&local_40,0);
      std::locale::locale<booster::locale::impl_posix::utf8_converter>((locale *)this,in,this_01);
      p_Var1 = &local_40;
    }
    else {
      this_02 = (std_converter<char> *)operator_new(0x20);
      std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
      std_converter<char>::std_converter(this_02,(shared_ptr<__locale_struct_*> *)&local_50,0);
      std::locale::locale<booster::locale::impl_posix::std_converter<char>>
                ((locale *)this,in,this_02);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    std::__cxx11::string::~string((string *)&encoding);
    return (locale)(_Impl *)this;
  }
  std::locale::locale((locale *)this,in);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_convert( std::locale const &in,
                            booster::shared_ptr<locale_t> lc,
                            character_facet_type type)
{
        switch(type) {
        case char_facet: 
            {
                std::string encoding = nl_langinfo_l(CODESET,*lc);
                for(unsigned i=0;i<encoding.size();i++)
                    if('A'<=encoding[i] && encoding[i]<='Z')
                        encoding[i]=encoding[i]-'A'+'a';
                if(encoding=="utf-8" || encoding=="utf8" || encoding=="utf_8") {
                    return std::locale(in,new utf8_converter(lc));
                }
                return std::locale(in,new std_converter<char>(lc));
            }
        case wchar_t_facet:
            return std::locale(in,new std_converter<wchar_t>(lc));
        default:
            return in;
        }
}